

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_2>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar6;
  double dVar7;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar8;
  undefined8 uVar9;
  FloatFormat *fmt;
  bool bVar10;
  ContextType type;
  int iVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  size_t sVar14;
  long *plVar15;
  ShaderExecutor *pSVar16;
  long lVar17;
  IVal *pIVar18;
  IVal *pIVar19;
  TestError *this_00;
  uint uVar20;
  TestLog *pTVar21;
  undefined1 *puVar22;
  Vector<float,_2> *val;
  Interval *__return_storage_ptr__;
  long lVar23;
  bool bVar24;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *local_528;
  pointer local_520;
  string local_518;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [56];
  double local_4b0;
  string local_4a8;
  undefined1 local_488 [8];
  _Rb_tree_node_base _Stack_480;
  double dStack_460;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_450;
  long local_448;
  ResultCollector *local_440;
  undefined1 local_438 [8];
  undefined1 auStack_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Rb_tree_node_base *local_418;
  Data DStack_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  pointer local_290;
  FloatFormat *local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4e8._40_8_ = (long)pVVar3 - (long)pVVar2 >> 3;
  local_528 = variables;
  local_4e8._48_8_ = stmt;
  local_450 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_250,local_4e8._40_8_);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"Statement: ",0xb);
  (*(*(_func_int ***)local_4e8._48_8_)[2])(local_4e8._48_8_,(ostringstream *)auStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  _Stack_480._0_8_ = (ulong)(uint)_Stack_480._4_4_ << 0x20;
  _Stack_480._M_parent = (_Base_ptr)0x0;
  dStack_460 = 0.0;
  local_520 = pVVar2;
  _Stack_480._M_left = &_Stack_480;
  _Stack_480._M_right = &_Stack_480;
  (*(*(_func_int ***)local_4e8._48_8_)[4])(local_4e8._48_8_,local_488);
  if (_Stack_480._M_left != &_Stack_480) {
    p_Var12 = _Stack_480._M_left;
    do {
      (**(code **)(**(long **)(p_Var12 + 1) + 0x30))(*(long **)(p_Var12 + 1),local_1a8);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != &_Stack_480);
  }
  if (dStack_460 != 0.0) {
    local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
      operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_488);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  pcVar13 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)((long)&local_528 + (long)((TestLog *)((long)local_438 + -0x18))->m_log) +
                    0xf0);
  }
  else {
    sVar14 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,pcVar13,sVar14);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar15 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar21 = (TestLog *)(plVar15 + 2);
    if ((TestLog *)*plVar15 == pTVar21) {
      local_428._M_allocated_capacity = (size_type)pTVar21->m_log;
      local_428._8_8_ = plVar15[3];
      local_438 = (undefined1  [8])(auStack_430 + 8);
    }
    else {
      local_428._M_allocated_capacity = (size_type)pTVar21->m_log;
      local_438 = (undefined1  [8])*plVar15;
    }
    auStack_430 = (undefined1  [8])plVar15[1];
    *plVar15 = (long)pTVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
      operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
    }
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (local_528->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar9 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,this,
             (local_528->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  makeSymbol<tcu::Matrix<float,2,2>>
            ((Symbol *)local_438,this,
             (local_528->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
    operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*(*(_func_int ***)local_4e8._48_8_)[2])(local_4e8._48_8_,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar16 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_438 = (undefined1  [8])
              (local_450->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  auStack_430 = (undefined1  [8])
                (local_450->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_428._M_allocated_capacity =
       (size_type)
       (local_450->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_428._8_8_ =
       (local_450->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar16->_vptr_ShaderExecutor[3])
            (pSVar16,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar11 = (*pSVar16->_vptr_ShaderExecutor[2])(pSVar16);
  if ((char)iVar11 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar16->_vptr_ShaderExecutor[5])(pSVar16);
  (*pSVar16->_vptr_ShaderExecutor[6])(pSVar16,local_4e8._40_8_,local_438,local_1a8);
  local_288 = &(this->m_ctx).floatFormat;
  local_4e8._32_8_ = this;
  (*pSVar16->_vptr_ShaderExecutor[1])(pSVar16);
  lVar17 = 0x10;
  do {
    local_1b8._M_local_buf[lVar17] = '\0';
    *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x40);
  lVar17 = 0x10;
  do {
    local_1b8._M_local_buf[lVar17] = '\0';
    *(undefined8 *)(local_1a8 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 == 0x28);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_438);
  pVVar8 = local_528;
  lVar17 = 0x10;
  do {
    local_488[lVar17 + -0x10] = 0;
    *(undefined8 *)(local_488 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 != 0x40);
  lVar17 = 0x10;
  do {
    local_488[lVar17 + -0x10] = 0;
    *(undefined8 *)(local_488 + lVar17 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
    lVar17 = lVar17 + 0x18;
  } while (lVar17 == 0x28);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (local_528->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar8->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_4f8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar8->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar8->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4a8);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&local_280,
             (pVVar8->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,(IVal *)local_438);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar8->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_488);
  if (pVVar3 == local_520) {
    local_4b0 = 0.0;
  }
  else {
    local_440 = (ResultCollector *)(local_4e8._32_8_ + 0x100);
    local_290 = (pointer)(local_4e8._40_8_ + (ulong)((double)local_4e8._40_8_ == 0.0));
    local_520 = (pointer)0x0;
    local_4b0 = 0.0;
    do {
      tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_1a8);
      lVar17 = 0x10;
      do {
        local_488[lVar17 + -0x10] = 0;
        *(undefined8 *)(local_488 + lVar17 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x40);
      lVar17 = 0x10;
      do {
        local_488[lVar17 + -0x10] = 0;
        *(undefined8 *)(local_488 + lVar17 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_488 + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 == 0x28);
      if (((ulong)local_520 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((((TestCase *)local_4e8._32_8_)->super_TestNode).m_testCtx);
      }
      fmt = local_288;
      local_518._M_dataplus._M_p =
           *(pointer *)
            (local_450->in0).
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(long)local_520].m_data;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4f8,local_288,(Vector<float,_2> *)&local_518);
      pVVar8 = local_528;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_4f8);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar8->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pIVar18->m_data[1].m_lo = (double)local_418;
      pIVar18->m_data[1].m_hi = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      pIVar18->m_data[0].m_hi = (double)local_428._M_allocated_capacity;
      *(undefined8 *)(pIVar18->m_data + 1) = local_428._8_8_;
      pIVar18->m_data[0].m_hasNaN = local_438;
      pIVar18->m_data[0].m_lo = (double)auStack_430;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar8->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar8->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar8->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      DStack_410.basic.type = ((Context *)(local_4e8._32_8_ + 0x70))->precision;
      local_418 = (_Rb_tree_node_base *)fmt->m_maxValue;
      local_438 = *(undefined1 (*) [8])fmt;
      auStack_430 = *(undefined1 (*) [8])&fmt->m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&fmt->m_hasInf;
      local_428._8_8_ = *(undefined8 *)&fmt->m_exactPrecision;
      local_400 = 0;
      DStack_410._8_8_ = &local_280;
      (*(*(_func_int ***)local_4e8._48_8_)[3])(local_4e8._48_8_,(IVal *)local_438);
      pIVar18 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (pVVar8->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar18);
      dStack_460 = (double)CONCAT44(DStack_410.basic.precision,DStack_410.basic.type);
      _Stack_480._M_right = local_418;
      _Stack_480._M_parent = (_Base_ptr)local_428._M_allocated_capacity;
      _Stack_480._M_left = (_Base_ptr)local_428._8_8_;
      local_488 = local_438;
      _Stack_480._0_8_ = auStack_430;
      local_448 = (long)local_520 * 8;
      bVar10 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                         ((IVal *)local_488,
                          local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_520);
      local_438 = (undefined1  [8])(auStack_430 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check(local_440,bVar10,(string *)local_438);
      pVVar8 = local_528;
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      pIVar19 = Environment::lookup<tcu::Matrix<float,2,2>>
                          ((Environment *)&local_280,
                           (pVVar8->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           .m_ptr);
      __return_storage_ptr__ = (Interval *)local_438;
      ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doConvert
                ((IVal *)__return_storage_ptr__,&local_2b8,pIVar19);
      pVVar2 = local_520;
      puVar22 = local_1a8;
      lVar17 = 0;
      do {
        lVar23 = 0;
        do {
          *(undefined8 *)(puVar22 + lVar23 + 0x10) =
               *(undefined8 *)((long)&__return_storage_ptr__->m_hi + lVar23);
          pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)&__return_storage_ptr__->m_hasNaN)
                    ->m_data[0].m_data[0].m_hasNaN + lVar23;
          dVar7 = *(double *)(pbVar1 + 8);
          *(undefined8 *)(puVar22 + lVar23) = *(undefined8 *)pbVar1;
          *(double *)((long)(puVar22 + lVar23) + 8) = dVar7;
          lVar23 = lVar23 + 0x30;
        } while (lVar23 == 0x30);
        puVar22 = puVar22 + 0x18;
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
        bVar24 = lVar17 == 0;
        lVar17 = lVar17 + 1;
      } while (bVar24);
      bVar24 = contains<tcu::Matrix<float,2,2>>
                         ((IVal *)local_1a8,
                          local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)local_520);
      local_438 = (undefined1  [8])(auStack_430 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar24 = tcu::ResultCollector::check(local_440,bVar24,(string *)local_438);
      if (local_438 != (undefined1  [8])(auStack_430 + 8)) {
        operator_delete((void *)local_438,(ulong)(local_428._M_allocated_capacity + 1));
      }
      uVar20 = SUB84(local_4b0,0) + ((byte)~(bVar10 && bVar24) & 1);
      local_4b0 = (double)(ulong)uVar20;
      if ((int)uVar20 < 0x65 && (!bVar10 || !bVar24)) {
        local_438 = (undefined1  [8])
                    ((((TestCase *)local_4e8._32_8_)->super_TestNode).m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
        pcVar13 = "Failed";
        if (bVar10 && bVar24) {
          pcVar13 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,pcVar13,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar4 = (local_528->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        val = (Vector<float,_2> *)local_4e8;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_518,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)((local_450->in0).
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_448),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_2> *)local_4f8._0_8_ != (Vector<float,_2> *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar6 = (local_528->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                 .m_ptr;
        pIVar19 = (IVal *)local_4e8;
        pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = pIVar19;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_518,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   (local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar2),
                   (Matrix<float,_2,_2> *)pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_4a8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\t",1);
        pVVar4 = (local_528->out1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                 .m_ptr;
        pIVar18 = (IVal *)local_4e8;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        local_4f8._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,(char *)local_4f8._0_8_,local_4f8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," = ",3);
        valueToString<tcu::Vector<float,2>>
                  (&local_518,(BuiltinPrecisionTests *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_250.out1.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + local_448),
                   (Vector<float,_2> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,2>>
                  (&local_4a8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_488,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_430,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
          operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4f8._0_8_ != (IVal *)local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
        std::ios_base::~ios_base(local_3c0);
      }
      local_520 = (pointer)((long)local_520->m_data + 1);
    } while (local_520 != local_290);
  }
  uVar9 = local_4e8._32_8_;
  iVar11 = SUB84(local_4b0,0);
  if (100 < iVar11) {
    local_438 = (undefined1  [8])((((TestCase *)local_4e8._32_8_)->super_TestNode).m_testCtx)->m_log
    ;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"(Skipped ",9);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar11 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  if (iVar11 == 0) {
    local_438 = (undefined1  [8])((((TestCase *)uVar9)->super_TestNode).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_438 = (undefined1  [8])((((TestCase *)uVar9)->super_TestNode).m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_430);
    std::ostream::operator<<((ostringstream *)auStack_430,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}